

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Operation.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Operation::ChFunction_Operation
          (ChFunction_Operation *this,ChFunction_Operation *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Operation_01190fe8;
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->op_type = other->op_type;
  iVar1 = (*((other->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->fa).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  iVar1 = (*((other->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var_00,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->fb).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChFunction_Operation::ChFunction_Operation(const ChFunction_Operation& other) {
    op_type = other.op_type;
    fa = std::shared_ptr<ChFunction>(other.fa->Clone());
    fb = std::shared_ptr<ChFunction>(other.fb->Clone());
}